

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O2

int stmm_insert(stmm_table *table,char *key,char *value)

{
  stmm_hash_func_type p_Var1;
  stmm_compare_func_type p_Var2;
  int iVar3;
  int iVar4;
  stmm_table_entry *psVar5;
  stmm_table_entry **ppsVar6;
  int local_48;
  
  p_Var1 = table->hash;
  iVar4 = (int)key;
  if (p_Var1 == stmm_ptrhash) {
    local_48 = (int)(((ulong)key >> 2) % (ulong)(long)table->num_bins);
  }
  else if (p_Var1 == stmm_numhash) {
    local_48 = -iVar4;
    if (0 < iVar4) {
      local_48 = iVar4;
    }
    local_48 = local_48 % table->num_bins;
  }
  else {
    local_48 = (*p_Var1)(key,table->num_bins);
  }
  ppsVar6 = table->bins + local_48;
  do {
    psVar5 = *ppsVar6;
    if (psVar5 == (stmm_table_entry *)0x0) {
      if (table->max_density <= table->num_entries / table->num_bins) {
        iVar3 = rehash(table);
        if (iVar3 == -10000) {
          return -10000;
        }
        p_Var1 = table->hash;
        if (p_Var1 == stmm_ptrhash) {
          local_48 = (int)(((ulong)key >> 2) % (ulong)(long)table->num_bins);
        }
        else if (p_Var1 == stmm_numhash) {
          local_48 = -iVar4;
          if (0 < iVar4) {
            local_48 = iVar4;
          }
          local_48 = local_48 % table->num_bins;
        }
        else {
          local_48 = (*p_Var1)(key,table->num_bins);
        }
      }
      psVar5 = (stmm_table_entry *)Extra_MmFixedEntryFetch((Extra_MmFixed_t *)table->pMemMan);
      if (psVar5 == (stmm_table_entry *)0x0) {
        iVar4 = -10000;
      }
      else {
        psVar5->key = key;
        psVar5->record = value;
        ppsVar6 = table->bins;
        psVar5->next = ppsVar6[local_48];
        ppsVar6[local_48] = psVar5;
        table->num_entries = table->num_entries + 1;
        iVar4 = 0;
      }
      return iVar4;
    }
    p_Var2 = table->compare;
    if (p_Var2 == stmm_numcmp || p_Var2 == stmm_ptrcmp) {
      if (psVar5->key == key) {
LAB_003defd1:
        if (table->reorder_flag != 0) {
          *ppsVar6 = psVar5->next;
          ppsVar6 = table->bins;
          psVar5->next = ppsVar6[local_48];
          ppsVar6[local_48] = psVar5;
        }
        psVar5->record = value;
        return 1;
      }
    }
    else {
      iVar3 = (*p_Var2)(key,psVar5->key);
      if (iVar3 == 0) goto LAB_003defd1;
    }
    ppsVar6 = &psVar5->next;
  } while( true );
}

Assistant:

int
stmm_insert (stmm_table *table, char *key, char *value)
{
    int hash_val;
    stmm_table_entry *newEntry;
    stmm_table_entry *ptr, **last;

    hash_val = do_hash (key, table);

    FIND_ENTRY (table, hash_val, key, ptr, last);

    if (ptr == NULL) {
    if (table->num_entries / table->num_bins >= table->max_density) {
        if (rehash (table) == STMM_OUT_OF_MEM) {
        return STMM_OUT_OF_MEM;
        }
        hash_val = do_hash (key, table);
    }

//              newEntry = ABC_ALLOC( stmm_table_entry, 1 );
    newEntry = (stmm_table_entry *) Extra_MmFixedEntryFetch ((Extra_MmFixed_t *)table->pMemMan);
    if (newEntry == NULL) {
        return STMM_OUT_OF_MEM;
    }

    newEntry->key = key;
    newEntry->record = value;
    newEntry->next = table->bins[hash_val];
    table->bins[hash_val] = newEntry;
    table->num_entries++;
    return 0;
    }
    else {
    ptr->record = value;
    return 1;
    }
}